

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<kj::ArrayPtr<void*const>&>
          (String *__return_storage_ptr__,kj *this,ArrayPtr<void_*const> *params)

{
  undefined8 local_48;
  undefined8 uStack_40;
  char *local_38;
  undefined8 local_30;
  Array<kj::CappedArray<char,_17UL>_> local_28;
  
  local_48 = *(undefined8 *)this;
  uStack_40 = *(undefined8 *)(this + 8);
  local_38 = ", ";
  local_30 = 3;
  local_28.ptr = (CappedArray<char,_17UL> *)0x0;
  local_28.size_ = 0;
  local_28.disposer = (ArrayDisposer *)0x0;
  _::concat<kj::_::Delimited<kj::ArrayPtr<void*const>>>
            (__return_storage_ptr__,(_ *)&local_48,(Delimited<kj::ArrayPtr<void_*const>_> *)params);
  Array<kj::CappedArray<char,_17UL>_>::~Array(&local_28);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}